

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_additionally_create_rb_nodes
                 (lyd_node **first_sibling,lyd_node **leader,lyd_meta *root_meta,rb_node **rbt,
                 lyd_node *node)

{
  lyd_node *plVar1;
  bool bVar2;
  LY_ERR ret__;
  lyd_node *next;
  lyd_node *iter;
  rb_node *rbn;
  ly_bool max;
  lyd_node *plStack_38;
  LY_ERR ret;
  lyd_node *node_local;
  rb_node **rbt_local;
  lyd_meta *root_meta_local;
  lyd_node **leader_local;
  lyd_node **first_sibling_local;
  
  plVar1 = node;
  plStack_38 = node;
  node_local = (lyd_node *)rbt;
  rbt_local = (rb_node **)root_meta;
  root_meta_local = (lyd_meta *)leader;
  leader_local = first_sibling;
  while( true ) {
    next = plVar1;
    bVar2 = false;
    if (next != (lyd_node *)0x0) {
      bVar2 = next->schema == root_meta_local->parent->schema;
    }
    if (!bVar2) break;
    plVar1 = next->next;
    rbn._4_4_ = lyds_create_node(next,(rb_node **)&iter);
    if (rbn._4_4_ != LY_SUCCESS) {
      return rbn._4_4_;
    }
    rb_insert_node((rb_node **)node_local,(rb_node *)iter,(ly_bool *)((long)&rbn + 3));
    if (rbn._3_1_ == '\0') {
      lyd_unlink_ignore_lyds(leader_local,next);
      lyds_link_data_node(leader_local,&root_meta_local->parent,next,(lyd_meta *)rbt_local,
                          (rb_node *)iter);
      lyd_insert_hash(next);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyds_additionally_create_rb_nodes(struct lyd_node **first_sibling, struct lyd_node **leader,
        struct lyd_meta *root_meta, struct rb_node **rbt, struct lyd_node *node)
{
    LY_ERR ret;
    ly_bool max;
    struct rb_node *rbn;
    struct lyd_node *iter, *next;

    for (iter = node; iter && (iter->schema == (*leader)->schema); iter = next) {
        next = iter->next;
        ret = lyds_create_node(iter, &rbn);
        LY_CHECK_RET(ret);
        rb_insert_node(rbt, rbn, &max);
        if (!max) {
            /* nodes were not sorted, they will be sorted now */
            lyd_unlink_ignore_lyds(first_sibling, iter);
            lyds_link_data_node(first_sibling, leader, iter, root_meta, rbn);
            lyd_insert_hash(iter);
        }
    }

    return LY_SUCCESS;
}